

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_dstr.c
# Opt level: O3

void arg_dstr_set(arg_dstr_t ds,char *str,arg_dstr_freefn *free_proc)

{
  char *ptr;
  arg_dstr_freefn *paVar1;
  size_t sVar2;
  char *__dest;
  arg_dstr_freefn *paVar3;
  
  ptr = ds->data;
  paVar1 = ds->free_proc;
  if (str == (char *)0x0) {
    ds->sbuf[0] = '\0';
    ds->data = ds->sbuf;
    ds->free_proc = (arg_dstr_freefn *)0x0;
  }
  else if (free_proc == (arg_dstr_freefn *)0x1) {
    sVar2 = strlen(str);
    if ((int)sVar2 < 0xc9) {
      __dest = ds->sbuf;
      paVar3 = (arg_dstr_freefn *)0x0;
    }
    else {
      __dest = (char *)argtable3_xmalloc((ulong)((int)sVar2 + 1));
      paVar3 = (arg_dstr_freefn *)0x3;
    }
    ds->data = __dest;
    ds->free_proc = paVar3;
    strcpy(__dest,str);
  }
  else {
    ds->data = str;
    ds->free_proc = free_proc;
  }
  if ((paVar1 != (arg_dstr_freefn *)0x0) && (ptr != ds->data)) {
    if (paVar1 == (arg_dstr_freefn *)0x3) {
      argtable3_xfree(ptr);
    }
    else {
      (*paVar1)(ptr);
    }
  }
  if ((ds->append_data != (char *)0x0) && (0 < ds->append_data_size)) {
    argtable3_xfree(ds->append_data);
    ds->append_data = (char *)0x0;
    ds->append_data_size = 0;
  }
  return;
}

Assistant:

void arg_dstr_set(arg_dstr_t ds, char* str, arg_dstr_freefn* free_proc) {
    int length;
    register arg_dstr_freefn* old_free_proc = ds->free_proc;
    char* old_result = ds->data;

    if (str == NULL) {
        ds->sbuf[0] = 0;
        ds->data = ds->sbuf;
        ds->free_proc = ARG_DSTR_STATIC;
    } else if (free_proc == ARG_DSTR_VOLATILE) {
        length = (int)strlen(str);
        if (length > ARG_DSTR_SIZE) {
            ds->data = (char*)xmalloc((unsigned)length + 1);
            ds->free_proc = ARG_DSTR_DYNAMIC;
        } else {
            ds->data = ds->sbuf;
            ds->free_proc = ARG_DSTR_STATIC;
        }
        strcpy(ds->data, str);
    } else {
        ds->data = str;
        ds->free_proc = free_proc;
    }

    /*
     * If the old result was dynamically-allocated, free it up. Do it here,
     * rather than at the beginning, in case the new result value was part of
     * the old result value.
     */

    if ((old_free_proc != 0) && (old_result != ds->data)) {
        if (old_free_proc == ARG_DSTR_DYNAMIC) {
            xfree(old_result);
        } else {
            (*old_free_proc)(old_result);
        }
    }

    if ((ds->append_data != NULL) && (ds->append_data_size > 0)) {
        xfree(ds->append_data);
        ds->append_data = NULL;
        ds->append_data_size = 0;
    }
}